

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest_extra.cc
# Opt level: O3

EVP_MD * EVP_get_digestbyobj(ASN1_OBJECT *obj)

{
  CBS *cbs;
  EVP_MD *pEVar1;
  long lVar2;
  
  if (obj->nid == 0) {
    cbs = (CBS *)OBJ_get0_data(obj);
    OBJ_length(obj);
    pEVar1 = cbs_to_md(cbs);
    return pEVar1;
  }
  lVar2 = 8;
  do {
    if (*(int *)((long)&PTR_anon_var_dwarf_24ac1c_002d4eb8 + lVar2) == obj->nid) {
      pEVar1 = (EVP_MD *)(**(code **)((long)&nid_to_digest_mapping[0].nid + lVar2))();
      return pEVar1;
    }
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x248);
  return (EVP_MD *)0x0;
}

Assistant:

const EVP_MD *EVP_get_digestbyobj(const ASN1_OBJECT *obj) {
  // Handle objects with no corresponding OID. Note we don't use |OBJ_obj2nid|
  // here to avoid pulling in the OID table.
  if (obj->nid != NID_undef) {
    return EVP_get_digestbynid(obj->nid);
  }

  CBS cbs;
  CBS_init(&cbs, OBJ_get0_data(obj), OBJ_length(obj));
  return cbs_to_md(&cbs);
}